

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport.c
# Opt level: O1

void IoTHubTransport_Destroy(TRANSPORT_HANDLE transportHandle)

{
  if (transportHandle != (TRANSPORT_HANDLE)0x0) {
    stop_worker_thread(transportHandle);
    wait_worker_thread(transportHandle);
    Lock_Deinit(transportHandle->lockHandle);
    (*transportHandle->IoTHubTransport_Destroy)(transportHandle->transportLLHandle);
    VECTOR_destroy(transportHandle->clients);
    Lock_Deinit(transportHandle->clientsLockHandle);
    free(transportHandle);
    return;
  }
  return;
}

Assistant:

void IoTHubTransport_Destroy(TRANSPORT_HANDLE transportHandle)
{
    if (transportHandle != NULL)
    {
        TRANSPORT_HANDLE_DATA * transportData = (TRANSPORT_HANDLE_DATA*)transportHandle;
        stop_worker_thread(transportData);
        wait_worker_thread(transportData);
        Lock_Deinit(transportData->lockHandle);
        (transportData->IoTHubTransport_Destroy)(transportData->transportLLHandle);
        VECTOR_destroy(transportData->clients);
        Lock_Deinit(transportData->clientsLockHandle);
        free(transportHandle);
    }
}